

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

int __thiscall Token::param(Token *this)

{
  int iVar1;
  _Alloc_hider __nptr;
  size_t sVar2;
  int *piVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  char *local_50;
  string local_48;
  
  sVar2 = size(this);
  if (sVar2 < 2) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  operator[][abi_cxx11_(&local_48,this,3);
  __nptr._M_p = local_48._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr._M_p,&local_50,10);
  if (local_50 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return (int)lVar4;
  }
  uVar6 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  param();
  _Unwind_Resume(uVar6);
}

Assistant:

int Token::param() const {
    if (size() < 2) throw -2;

    return std::stoi((*this)[3]);
}